

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

void __thiscall
vkt::rasterization::anon_unknown_0::CullingTestInstance::extractLines
          (CullingTestInstance *this,
          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          *outTriangles,
          vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
          *outLines)

{
  size_type sVar1;
  reference pvVar2;
  undefined1 local_a8 [8];
  SceneLine line;
  SceneLine line_1;
  int vrtxNdx;
  int triNdx;
  vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
  *outLines_local;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  *outTriangles_local;
  CullingTestInstance *this_local;
  
  line_1.colors[1].m_data[3] = 0.0;
  while( true ) {
    sVar1 = std::
            vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            ::size(outTriangles);
    if ((int)sVar1 <= (int)line_1.colors[1].m_data[3]) break;
    for (line_1.colors[1].m_data[2] = 0.0; (int)line_1.colors[1].m_data[2] < 2;
        line_1.colors[1].m_data[2] = (float)((int)line_1.colors[1].m_data[2] + 1)) {
      tcu::LineSceneSpec::SceneLine::SceneLine((SceneLine *)(line.colors[1].m_data + 2));
      pvVar2 = std::
               vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
               ::at(outTriangles,(long)(int)line_1.colors[1].m_data[3]);
      line.colors[1].m_data._8_8_ =
           *(undefined8 *)pvVar2->positions[(int)line_1.colors[1].m_data[2]].m_data;
      std::
      vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ::at(outTriangles,(long)(int)line_1.colors[1].m_data[3]);
      std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
      push_back(outLines,(value_type *)(line.colors[1].m_data + 2));
    }
    tcu::LineSceneSpec::SceneLine::SceneLine((SceneLine *)local_a8);
    pvVar2 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::at(outTriangles,(long)(int)line_1.colors[1].m_data[3]);
    local_a8 = *(undefined1 (*) [8])pvVar2->positions[2].m_data;
    line.positions[0].m_data._0_8_ = *(undefined8 *)(pvVar2->positions[2].m_data + 2);
    pvVar2 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::at(outTriangles,(long)(int)line_1.colors[1].m_data[3]);
    line.positions[0].m_data._8_8_ = *(undefined8 *)pvVar2->positions[0].m_data;
    line.positions[1].m_data._0_8_ = *(undefined8 *)(pvVar2->positions[0].m_data + 2);
    std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
    push_back(outLines,(value_type *)local_a8);
    line_1.colors[1].m_data[3] = (float)((int)line_1.colors[1].m_data[3] + 1);
  }
  return;
}

Assistant:

void CullingTestInstance::extractLines (std::vector<TriangleSceneSpec::SceneTriangle>&	outTriangles,
										std::vector<LineSceneSpec::SceneLine>&			outLines) const
{
	for (int triNdx = 0; triNdx < (int)outTriangles.size(); ++triNdx)
	{
		for (int vrtxNdx = 0; vrtxNdx < 2; ++vrtxNdx)
		{
			LineSceneSpec::SceneLine line;
			line.positions[0] = outTriangles.at(triNdx).positions[vrtxNdx];
			line.positions[1] = outTriangles.at(triNdx).positions[vrtxNdx + 1];

			outLines.push_back(line);
		}
		LineSceneSpec::SceneLine line;
		line.positions[0] = outTriangles.at(triNdx).positions[2];
		line.positions[1] = outTriangles.at(triNdx).positions[0];
		outLines.push_back(line);
	}
}